

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlTestReporter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cd03::TestXmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormat::
TestXmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormat
          (TestXmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormat *this)

{
  char *suiteName;
  TestXmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormat *this_local;
  
  suiteName = UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"SingleSuccessfulTestReportSummaryFormat",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/UnitTest++/src/tests/TestXmlTestReporter.cpp"
             ,0x50);
  (this->super_Test)._vptr_Test =
       (_func_int **)
       &PTR__TestXmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormat_00185aa8;
  return;
}

Assistant:

TEST_FIXTURE(XmlTestReporterFixture, SingleSuccessfulTestReportSummaryFormat)
{
    TestDetails const details("TestName", "DefaultSuite", "", 0);

    reporter.ReportTestStart(details);
    reporter.ReportSummary(1, 0, 0, 0.1f);

    const char *expected =
"<?xml version=\"1.0\"?>"
"<unittest-results tests=\"1\" failedtests=\"0\" failures=\"0\" time=\"0.1\">"
"<test suite=\"DefaultSuite\" name=\"TestName\" time=\"0\"/>"
"</unittest-results>";

    CHECK_EQUAL(expected, output.str());
}